

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void inven_takeoff(object *obj)

{
  _Bool _Var1;
  char cVar2;
  wchar_t slot_00;
  artifact_set *set_00;
  artifact_set *set;
  char o_name [80];
  char *local_20;
  char *act;
  wchar_t slot;
  object *obj_local;
  
  slot_00 = equipped_item_slot(player->body,obj);
  if (slot_00 != (uint)(player->body).count) {
    if ((obj->artifact != (artifact *)0x0) &&
       (set_00 = check_sets(obj->artifact), set_00 != (artifact_set *)0x0)) {
      remove_set(set_00);
    }
    object_desc((char *)&set,0x50,obj,0x43,player);
    _Var1 = slot_type_is(player,slot_00,L'\x01');
    if (_Var1) {
      local_20 = "You were wielding";
    }
    else {
      _Var1 = slot_type_is(player,slot_00,L'\x02');
      if (_Var1) {
        local_20 = "You were holding";
      }
      else {
        _Var1 = slot_type_is(player,slot_00,L'\x05');
        if (_Var1) {
          local_20 = "You were holding";
        }
        else {
          local_20 = "You were wearing";
        }
      }
    }
    (player->body).slots[slot_00].obj = (object *)0x0;
    player->upkeep->equip_cnt = player->upkeep->equip_cnt + L'\xffffffff';
    player->upkeep->update = player->upkeep->update | 0x441;
    player->upkeep->notice = player->upkeep->notice | 2;
    update_stuff(player);
    cVar2 = gear_to_label(player,obj);
    msgt(0x80,"%s %s (%c).",local_20,&set,(ulong)(uint)(int)cVar2);
  }
  return;
}

Assistant:

void inven_takeoff(struct object *obj)
{
	int slot = equipped_item_slot(player->body, obj);
	const char *act;
	char o_name[80];

	/* Paranoia */
	if (slot == player->body.count) return;

	/* Check to see if a set item is being removed */
	if (obj->artifact) {
		struct artifact_set *set = check_sets(obj->artifact);
		if (set) {
			remove_set(set);
		}
	}

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Describe removal by slot */
	if (slot_type_is(player, slot, EQUIP_WEAPON))
		act = "You were wielding";
	else if (slot_type_is(player, slot, EQUIP_BOW))
		act = "You were holding";
	else if (slot_type_is(player, slot, EQUIP_LIGHT))
		act = "You were holding";
	else
		act = "You were wearing";

	/* De-equip the object */
	player->body.slots[slot].obj = NULL;
	player->upkeep->equip_cnt--;

	player->upkeep->update |= (PU_BONUS | PU_INVEN | PU_UPDATE_VIEW);
	player->upkeep->notice |= (PN_IGNORE);
	update_stuff(player);

	/* Message */
	msgt(MSG_WIELD, "%s %s (%c).", act, o_name, gear_to_label(player, obj));

	return;
}